

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

void mpi_sub_hlp(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  ulong uVar1;
  ulong uVar2;
  ulong local_68;
  mbedtls_mpi_uint z_1;
  mbedtls_mpi_uint a_1;
  mbedtls_mpi_uint z;
  mbedtls_mpi_uint b;
  mbedtls_mpi_uint a;
  size_t width;
  mbedtls_mpi_uint c;
  size_t i;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  width = 0;
  if (B->n < A->n) {
    local_68 = B->n;
  }
  else {
    local_68 = A->n;
  }
  for (c = 0; c < local_68; c = c + 1) {
    uVar1 = A->p[c];
    uVar2 = B->p[c];
    X->p[c] = uVar1 - width;
    width = (long)(int)(uint)(X->p[c] < uVar2) + (long)(int)(uint)(uVar1 < width);
    X->p[c] = X->p[c] - uVar2;
  }
  for (; c < A->n && width != 0; c = c + 1) {
    uVar1 = A->p[c];
    X->p[c] = uVar1 - width;
    width = (long)(int)(uint)(uVar1 < width);
  }
  for (; c < A->n; c = c + 1) {
    X->p[c] = A->p[c];
  }
  for (; c < X->n; c = c + 1) {
    X->p[c] = 0;
  }
  return;
}

Assistant:

static void mpi_sub_hlp( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    size_t i;
    mbedtls_mpi_uint c = 0;
    size_t width = A->n > B->n ? B->n : A->n;

    for( i = 0; i < width; i++ )
    {
        mbedtls_mpi_uint a = A->p[i];
        mbedtls_mpi_uint b = B->p[i];
        mbedtls_mpi_uint z = a < c;

        X->p[i] = a - c;
        c = ( X->p[i] <  b ) + z;
        X->p[i] -= b;
    }

    for( ; i < A->n && c > 0; i++ )
    {
        mbedtls_mpi_uint a = A->p[i];
        mbedtls_mpi_uint z = a < c;
        X->p[i] = a - c;
        c = z;
    }

    for( ; i < A->n; i++ )
    {
        X->p[i] = A->p[i];
    }

    for( ; i < X->n; i++ )
    {
        X->p[i] = 0;
    }
}